

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O1

int32_t icu_63::parseAsciiDigits(UnicodeString *str,int32_t start,int32_t length,UErrorCode *status)

{
  ushort uVar1;
  short sVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  char16_t *pcVar6;
  char16_t cVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  if (0 < length) {
    uVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
    if ((short)uVar1 < 0) {
      uVar8 = (str->fUnion).fFields.fLength;
    }
    else {
      uVar8 = (int)(short)uVar1 >> 5;
    }
    if (length + start <= (int)uVar8 && start <= (int)uVar8) {
      iVar5 = 1;
      if ((uint)start < uVar8) {
        if (((int)(short)uVar1 & 2U) == 0) {
          pcVar6 = (str->fUnion).fFields.fArray;
        }
        else {
          pcVar6 = (char16_t *)((long)&str->fUnion + 2);
        }
        if (pcVar6[start] == L'+') {
          start = start + 1;
          length = length - 1;
        }
        else if ((uint)start < uVar8) {
          if ((uVar1 & 2) == 0) {
            pcVar6 = (str->fUnion).fFields.fArray;
          }
          else {
            pcVar6 = (char16_t *)((long)&str->fUnion + 2);
          }
          if (pcVar6[start] == L'-') {
            start = start + 1;
            length = length - 1;
            iVar5 = -1;
          }
        }
      }
      bVar10 = 0 < length;
      if (length < 1) {
        iVar3 = 0;
      }
      else {
        lVar4 = (long)start;
        iVar3 = 0;
        uVar9 = 1;
        do {
          sVar2 = (str->fUnion).fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            uVar8 = (str->fUnion).fFields.fLength;
          }
          else {
            uVar8 = (int)sVar2 >> 5;
          }
          cVar7 = L'\xffff';
          if ((uint)start < uVar8) {
            pcVar6 = (char16_t *)((long)&str->fUnion + 2);
            if (((int)sVar2 & 2U) == 0) {
              pcVar6 = (str->fUnion).fFields.fArray;
            }
            cVar7 = pcVar6[lVar4];
          }
          if (9 < (ushort)(cVar7 + L'￐')) {
            *status = U_INVALID_FORMAT_ERROR;
            break;
          }
          iVar3 = (uint)(ushort)cVar7 + iVar3 * 10 + -0x30;
          bVar10 = uVar9 < (uint)length;
          lVar4 = lVar4 + 1;
          start = start + 1;
          bVar11 = uVar9 != (uint)length;
          uVar9 = uVar9 + 1;
        } while (bVar11);
      }
      iVar5 = iVar3 * iVar5;
      if (bVar10) {
        iVar5 = 0;
      }
      return iVar5;
    }
  }
  *status = U_INVALID_FORMAT_ERROR;
  return 0;
}

Assistant:

static int32_t parseAsciiDigits(const UnicodeString& str, int32_t start, int32_t length, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return 0;
    }
    if (length <= 0 || str.length() < start || (start + length) > str.length()) {
        status = U_INVALID_FORMAT_ERROR;
        return 0;
    }
    int32_t sign = 1;
    if (str.charAt(start) == PLUS) {
        start++;
        length--;
    } else if (str.charAt(start) == MINUS) {
        sign = -1;
        start++;
        length--;
    }
    int32_t num = 0;
    for (int32_t i = 0; i < length; i++) {
        int32_t digit = str.charAt(start + i) - 0x0030;
        if (digit < 0 || digit > 9) {
            status = U_INVALID_FORMAT_ERROR;
            return 0;
        }
        num = 10 * num + digit;
    }
    return sign * num;    
}